

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O2

void __thiscall QSystemTrayIconPrivate::updateMenu_sys(QSystemTrayIconPrivate *this)

{
  Data *pDVar1;
  QPlatformSystemTrayIcon *pQVar2;
  code *UNRECOVERED_JUMPTABLE;
  bool bVar3;
  QPlatformMenu *pQVar4;
  undefined8 extraout_RDX;
  QObject *menu;
  
  if (this->qpa_sys != (QPlatformSystemTrayIcon *)0x0) {
    bVar3 = QPointer::operator_cast_to_bool((QPointer *)&this->menu);
    if (bVar3) {
      pDVar1 = (this->menu).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        menu = (QObject *)0x0;
      }
      else {
        menu = (this->menu).wp.value;
      }
      addPlatformMenu(this,(QMenu *)menu);
      pQVar2 = this->qpa_sys;
      pQVar4 = QMenu::platformMenu((QMenu *)(this->menu).wp.value);
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)pQVar2 + 0x80);
      (*UNRECOVERED_JUMPTABLE)(pQVar2,pQVar4,extraout_RDX,UNRECOVERED_JUMPTABLE);
      return;
    }
  }
  return;
}

Assistant:

void QSystemTrayIconPrivate::updateMenu_sys()
{
#if QT_CONFIG(menu)
    if (qpa_sys && menu) {
        addPlatformMenu(menu);
        qpa_sys->updateMenu(menu->platformMenu());
    }
#endif
}